

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CCard::CCard(CCard *this,istream *in)

{
  char *pcVar1;
  undefined1 *puVar2;
  runtime_error *this_00;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [8];
  string card;
  istream *in_local;
  CCard *this_local;
  
  this->m_value = 0;
  this->m_suit = 0;
  card.field_2._8_8_ = in;
  std::__cxx11::string::string(local_38);
  std::operator>>((istream *)card.field_2._8_8_,local_38);
  std::istream::ignore();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if ((*pcVar1 < '2') ||
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38), '9' < *pcVar1)) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar1 == '1') {
      this->m_value = 10;
      std::__cxx11::string::substr((ulong)local_88,(ulong)local_38);
      std::__cxx11::string::operator=(local_38,local_88);
      std::__cxx11::string::~string(local_88);
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar1 == 'J') {
        this->m_value = 0xb;
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_38);
        std::__cxx11::string::operator=(local_38,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
      else {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if (*pcVar1 == 'Q') {
          this->m_value = 0xc;
          std::__cxx11::string::substr((ulong)local_c8,(ulong)local_38);
          std::__cxx11::string::operator=(local_38,local_c8);
          std::__cxx11::string::~string(local_c8);
        }
        else {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar1 == 'K') {
            this->m_value = 0xd;
            std::__cxx11::string::substr((ulong)local_e8,(ulong)local_38);
            std::__cxx11::string::operator=(local_38,local_e8);
            std::__cxx11::string::~string(local_e8);
          }
          else {
            pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
            if (*pcVar1 == 'A') {
              this->m_value = 0xe;
              std::__cxx11::string::substr((ulong)local_108,(ulong)local_38);
              std::__cxx11::string::operator=(local_38,local_108);
              std::__cxx11::string::~string(local_108);
            }
          }
        }
      }
    }
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    this->m_value = *pcVar1 + -0x30;
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_38);
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
  }
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
  switch(*puVar2) {
  case 0x43:
    this->m_suit = 3;
    break;
  case 0x44:
    this->m_suit = 1;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unexpected suit");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x48:
    this->m_suit = 2;
    break;
  case 0x53:
    this->m_suit = 4;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

CCard(std::istream& in): m_value(0), m_suit(0)
        {
            std::string card;
            in >> card;
            in.ignore();
            if ('2' <= card[0] && '9' >= card[0])
            {
                m_value = card[0] - '0';
                card = card.substr(1);
            }
            else if ('1' == card[0])
            {
                m_value = 10;
                card = card.substr(2);
            }
            else if ('J' == card[0])
            {
                m_value = 11;
                card = card.substr(1);
            }
            else if ('Q' == card[0])
            {
                m_value = 12;
                card = card.substr(1);
            }
            else if ('K' == card[0])
            {
                m_value = 13;
                card = card.substr(1);
            }
            else if ('A' == card[0])
            {
                m_value = 14;
                card = card.substr(1);
            }
            
            switch (card[0])
            {
                case 'D':
                    m_suit = 1;
                    break;
                    
                case 'H':
                    m_suit = 2;
                    break;
                    
                case 'C':
                    m_suit = 3;
                    break;
                    
                case 'S':
                    m_suit = 4;
                    break;
                    
                default:
                    throw std::runtime_error("Unexpected suit");
            }
        }